

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O2

FunctionBody * TTD::JsSupport::ForceAndGetFunctionBody(ParseableFunctionInfo *pfi)

{
  BOOL BVar1;
  DeferDeserializeFunctionInfo *this;
  FunctionBody *this_00;
  ParseableFunctionInfo *this_01;
  
  BVar1 = Js::FunctionProxy::IsDeferredDeserializeFunction(&pfi->super_FunctionProxy);
  if (BVar1 == 0) {
    BVar1 = Js::FunctionProxy::IsDeferredParseFunction(&pfi->super_FunctionProxy);
    if (BVar1 == 0) {
      this_00 = Js::FunctionProxy::GetFunctionBody(&pfi->super_FunctionProxy);
    }
    else {
      this_01 = Js::FunctionProxy::GetParseableFunctionInfo(&pfi->super_FunctionProxy);
      this_00 = Js::ParseableFunctionInfo::Parse(this_01,(ScriptFunction **)0x0,false);
    }
  }
  else {
    this = Js::FunctionProxy::GetDeferDeserializeFunctionInfo(&pfi->super_FunctionProxy);
    this_00 = Js::DeferDeserializeFunctionInfo::Deserialize(this);
  }
  if (this_00 != (FunctionBody *)0x0) {
    Js::FunctionProxy::EnsureDeserialized((FunctionProxy *)this_00);
    return this_00;
  }
  TTDAbort_unrecoverable_error("I just want a function body!!!");
}

Assistant:

Js::FunctionBody* ForceAndGetFunctionBody(Js::ParseableFunctionInfo* pfi)
        {
            Js::FunctionBody* fb = nullptr;

            if(pfi->IsDeferredDeserializeFunction())
            {
                Js::DeferDeserializeFunctionInfo* deferDeserializeInfo = pfi->GetDeferDeserializeFunctionInfo();
                fb = deferDeserializeInfo->Deserialize();
            }
            else
            {
                if(pfi->IsDeferredParseFunction())
                {
                    fb = pfi->GetParseableFunctionInfo()->Parse();
                }
                else
                {
                    fb = pfi->GetFunctionBody();
                }
            }
            TTDAssert(fb != nullptr, "I just want a function body!!!");

            fb->EnsureDeserialized();
            return fb;
        }